

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O3

natwm_error workspace_list_init(natwm_state *state,workspace_list **result)

{
  char *pcVar1;
  config_value *pcVar2;
  workspace **ppwVar3;
  void *pvVar4;
  config_array *pcVar5;
  natwm_state *state_00;
  natwm_error nVar6;
  workspace_list *workspace_list;
  size_t sVar7;
  workspace *pwVar8;
  node *pnVar9;
  size_t i;
  ulong uVar10;
  ulong uVar11;
  undefined8 in_R9;
  char **ppcVar12;
  char *__s;
  undefined8 uVar13;
  config_array *local_48;
  config_array *workspace_names;
  natwm_state *local_38;
  
  uVar13 = 0x108fcd;
  local_48 = (config_array *)0x0;
  config_find_array(state->config,"workspaces",&local_48);
  workspace_list = workspace_list_create(10);
  nVar6 = MEMORY_ALLOCATION_ERROR;
  if (workspace_list != (workspace_list *)0x0) {
    ppcVar12 = DEFAULT_WORKSPACE_NAMES;
    uVar10 = 0;
    workspace_names = (config_array *)result;
    local_38 = state;
    do {
      pcVar1 = *ppcVar12;
      __s = pcVar1;
      if ((local_48 != (config_array *)0x0) && (uVar10 < local_48->length)) {
        pcVar2 = local_48->values[uVar10];
        if ((pcVar2 == (config_value *)0x0) || (pcVar2->type != STRING)) {
          internal_logger(natwm_logger,LEVEL_WARNING,"Ignoring invalid workspace name",pcVar1);
        }
        else {
          __s = (pcVar2->data).string;
          sVar7 = strlen(__s);
          if (0x32 < sVar7) {
            internal_logger(natwm_logger,LEVEL_WARNING,
                            "Workspace name \'%s\' is too long. Max length is %zu",__s,0x32,in_R9,
                            uVar13);
            __s = pcVar1;
          }
        }
      }
      pwVar8 = workspace_create(__s,uVar10);
      state_00 = local_38;
      pcVar5 = workspace_names;
      if (pwVar8 == (workspace *)0x0) {
        workspace_list_destroy(workspace_list);
        return MEMORY_ALLOCATION_ERROR;
      }
      ppwVar3 = workspace_list->workspaces;
      ppwVar3[uVar10] = pwVar8;
      uVar10 = uVar10 + 1;
      ppcVar12 = ppcVar12 + 1;
    } while (uVar10 != 10);
    pnVar9 = local_38->monitor_list->monitors->head;
    if (pnVar9 != (node *)0x0) {
      uVar10 = workspace_list->count;
      uVar11 = 0;
      do {
        if ((uVar10 <= uVar11) || (pwVar8 = ppwVar3[uVar11], pwVar8 == (workspace *)0x0)) {
          internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find workspace for monitor");
          break;
        }
        pvVar4 = pnVar9->data;
        if (uVar11 == 0) {
          workspace_list->active_index = 0;
          pwVar8->is_focused = true;
        }
        pwVar8->is_visible = true;
        *(workspace **)((long)pvVar4 + 0x18) = pwVar8;
        uVar11 = uVar11 + 1;
        pnVar9 = pnVar9->next;
      } while (pnVar9 != (node *)0x0);
    }
    ewmh_update_current_desktop(state_00,workspace_list->active_index);
    ewmh_update_desktop_names(state_00,workspace_list);
    reset_input_focus(state_00);
    pcVar5->length = (size_t)workspace_list;
    nVar6 = NO_ERROR;
  }
  return nVar6;
}

Assistant:

enum natwm_error workspace_list_init(const struct natwm_state *state,
                                     struct workspace_list **result)
{
        // First get the list of workspace names
        const struct config_array *workspace_names = NULL;

        config_find_array(state->config, "workspaces", &workspace_names);

        struct workspace_list *workspace_list = workspace_list_create(NATWM_WORKSPACE_COUNT);

        if (workspace_list == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        for (size_t i = 0; i < NATWM_WORKSPACE_COUNT; ++i) {
                struct workspace *workspace = workspace_init(workspace_names, i);

                if (workspace == NULL) {
                        workspace_list_destroy(workspace_list);

                        return MEMORY_ALLOCATION_ERROR;
                }

                workspace_list->workspaces[i] = workspace;
        }

        attach_to_monitors(state->monitor_list, workspace_list);

        ewmh_update_current_desktop(state, workspace_list->active_index);
        ewmh_update_desktop_names(state, workspace_list);

        reset_input_focus(state);

        *result = workspace_list;

        return NO_ERROR;
}